

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPController.cpp
# Opt level: O1

void __thiscall
cppti::HTTPController::routeSpeakers(HTTPController *this,Request *param_1,Response *res)

{
  vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_> *__x;
  json json;
  vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_> speakers;
  undefined1 local_68 [8];
  json_value local_60;
  __normal_iterator<const_cppti::TalksDB::Speaker_*,_std::vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>_>
  local_58;
  string_t local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  char *local_18;
  
  __x = TalksDB::getSpeakerList((this->talksdb)._M_data);
  std::vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>::vector
            ((vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_> *)&local_30,
             __x);
  local_60.object = (object_t *)0x0;
  local_68[0] = array;
  local_50._M_dataplus._M_p = (pointer)local_30._M_allocated_capacity;
  local_58._M_current = (Speaker *)local_30._8_8_;
  local_60.string =
       (string_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::
       create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,__gnu_cxx::__normal_iterator<cppti::TalksDB::Speaker_const*,std::vector<cppti::TalksDB::Speaker,std::allocator<cppti::TalksDB::Speaker>>>,__gnu_cxx::__normal_iterator<cppti::TalksDB::Speaker_const*,std::vector<cppti::TalksDB::Speaker,std::allocator<cppti::TalksDB::Speaker>>>>
                 (&local_50,&local_58);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_68);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_68);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump(&local_50,
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)local_68,-1,' ',false,strict);
  std::__cxx11::string::_M_assign((string *)&res->body);
  local_58._M_current = (Speaker *)0x165bfb;
  local_18 = "application/json";
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_equal<char_const*&,char_const*&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&res->headers,(char **)&local_58,&local_18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_68);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_68 + 8),local_68[0]);
  std::vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>::~vector
            ((vector<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_> *)&local_30)
  ;
  return;
}

Assistant:

void HTTPController::routeSpeakers(Request const&, Response& res)
{
  auto const speakers = this->talksdb.get().getSpeakerList();
  nlohmann::json const json = speakers;
  res.set_content(json.dump(), "application/json");
}